

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O1

TimeZone * icu_63::ZoneMeta::createCustomTimeZone(int32_t offset)

{
  ulong uVar1;
  SimpleTimeZone *this;
  uint uVar2;
  UnicodeString zid;
  UnicodeString local_50;
  size_t size;
  
  uVar1 = (ulong)(uint)-offset;
  if (0 < offset) {
    uVar1 = (ulong)(uint)offset;
  }
  uVar2 = (int)(uVar1 / 60000) + (int)((uVar1 / 60000) / 0x3c) * -0x3c;
  size = (size_t)uVar2;
  local_50.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
  local_50.fUnion.fStackFields.fLengthAndFlags = 2;
  formatCustomID((uint8_t)(uVar1 / 3600000),(uint8_t)uVar2,
                 (char)(uVar1 / 1000) + (char)((uVar1 / 1000) * 0x4444445 >> 0x20) * -0x3c,
                 (byte)((uint)offset >> 0x1f),&local_50);
  this = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,size);
  if (this == (SimpleTimeZone *)0x0) {
    this = (SimpleTimeZone *)0x0;
  }
  else {
    SimpleTimeZone::SimpleTimeZone(this,offset,&local_50);
  }
  UnicodeString::~UnicodeString(&local_50);
  return (TimeZone *)this;
}

Assistant:

TimeZone*
ZoneMeta::createCustomTimeZone(int32_t offset) {
    UBool negative = FALSE;
    int32_t tmp = offset;
    if (offset < 0) {
        negative = TRUE;
        tmp = -offset;
    }
    uint8_t hour, min, sec;

    tmp /= 1000;
    sec = static_cast<uint8_t>(tmp % 60);
    tmp /= 60;
    min = static_cast<uint8_t>(tmp % 60);
    hour = static_cast<uint8_t>(tmp / 60);

    UnicodeString zid;
    formatCustomID(hour, min, sec, negative, zid);
    return new SimpleTimeZone(offset, zid);
}